

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddAbs.c
# Opt level: O1

int addCheckPositiveCube(DdManager *manager,DdNode *cube)

{
  while( true ) {
    if (((ulong)cube & 1) != 0) {
      return 0;
    }
    if (manager->one == cube) {
      return 1;
    }
    if (cube->index == 0x7fffffff) {
      return 0;
    }
    if ((cube->type).kids.E != manager->zero) break;
    cube = (cube->type).kids.T;
  }
  return 0;
}

Assistant:

static int
addCheckPositiveCube(
  DdManager * manager,
  DdNode * cube)
{
    if (Cudd_IsComplement(cube)) return(0);
    if (cube == DD_ONE(manager)) return(1);
    if (cuddIsConstant(cube)) return(0);
    if (cuddE(cube) == DD_ZERO(manager)) {
        return(addCheckPositiveCube(manager, cuddT(cube)));
    }
    return(0);

}